

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

ostream * __thiscall wasm::anon_unknown_0::TypePrinter::print(TypePrinter *this,Type type)

{
  bool bVar1;
  BasicType BVar2;
  BasicHeapType BVar3;
  Tuple *tuple;
  HeapType local_28;
  HeapType heapType;
  TypePrinter *this_local;
  Type type_local;
  
  heapType.id = (uintptr_t)this;
  this_local = (TypePrinter *)type.id;
  bVar1 = wasm::Type::isBasic((Type *)&this_local);
  if (bVar1) {
    BVar2 = wasm::Type::getBasic((Type *)&this_local);
    switch(BVar2) {
    case none:
      type_local.id = (uintptr_t)std::operator<<(this->os,"none");
      break;
    case unreachable:
      type_local.id = (uintptr_t)std::operator<<(this->os,"unreachable");
      break;
    case i32:
      type_local.id = (uintptr_t)std::operator<<(this->os,"i32");
      break;
    case i64:
      type_local.id = (uintptr_t)std::operator<<(this->os,"i64");
      break;
    case f32:
      type_local.id = (uintptr_t)std::operator<<(this->os,"f32");
      break;
    case f64:
      type_local.id = (uintptr_t)std::operator<<(this->os,"f64");
      break;
    case v128:
      type_local.id = (uintptr_t)std::operator<<(this->os,"v128");
      break;
    default:
      goto switchD_026778a4_default;
    }
  }
  else {
switchD_026778a4_default:
    bVar1 = wasm::Type::isTuple((Type *)&this_local);
    if (bVar1) {
      tuple = wasm::Type::getTuple((Type *)&this_local);
      print(this,tuple);
    }
    else {
      bVar1 = wasm::Type::isRef((Type *)&this_local);
      if (!bVar1) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                           ,0x6d3);
      }
      local_28 = wasm::Type::getHeapType((Type *)&this_local);
      bVar1 = wasm::Type::isNullable((Type *)&this_local);
      if (((bVar1) && (bVar1 = HeapType::isBasic(&local_28), bVar1)) &&
         (bVar1 = HeapType::isShared(&local_28), !bVar1)) {
        bVar1 = wasm::Type::isExact((Type *)&this_local);
        if (bVar1) {
          std::operator<<(this->os,"(exact ");
        }
        BVar3 = HeapType::getBasic(&local_28,Unshared);
        switch(BVar3) {
        case ext:
          std::operator<<(this->os,"externref");
          break;
        case func:
          std::operator<<(this->os,"funcref");
          break;
        case cont:
          std::operator<<(this->os,"contref");
          break;
        case any:
          std::operator<<(this->os,"anyref");
          break;
        case eq:
          std::operator<<(this->os,"eqref");
          break;
        case i31:
          std::operator<<(this->os,"i31ref");
          break;
        case struct_:
          std::operator<<(this->os,"structref");
          break;
        case array:
          std::operator<<(this->os,"arrayref");
          break;
        case exn:
          std::operator<<(this->os,"exnref");
          break;
        case string:
          std::operator<<(this->os,"stringref");
          break;
        case none:
          std::operator<<(this->os,"nullref");
          break;
        case noext:
          std::operator<<(this->os,"nullexternref");
          break;
        case nofunc:
          std::operator<<(this->os,"nullfuncref");
          break;
        case nocont:
          std::operator<<(this->os,"nullcontref");
          break;
        case noexn:
          std::operator<<(this->os,"nullexnref");
        }
        bVar1 = wasm::Type::isExact((Type *)&this_local);
        if (bVar1) {
          std::operator<<(this->os,')');
        }
        return this->os;
      }
      std::operator<<(this->os,"(ref ");
      bVar1 = wasm::Type::isNullable((Type *)&this_local);
      if (bVar1) {
        std::operator<<(this->os,"null ");
      }
      bVar1 = wasm::Type::isExact((Type *)&this_local);
      if (bVar1) {
        std::operator<<(this->os,"(exact ");
      }
      printHeapTypeName(this,local_28);
      bVar1 = wasm::Type::isExact((Type *)&this_local);
      if (bVar1) {
        std::operator<<(this->os,')');
      }
      std::operator<<(this->os,')');
    }
    type_local.id = (uintptr_t)this->os;
  }
  return (ostream *)type_local.id;
}

Assistant:

std::ostream& TypePrinter::print(Type type) {
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::none:
        return os << "none";
      case Type::unreachable:
        return os << "unreachable";
      case Type::i32:
        return os << "i32";
      case Type::i64:
        return os << "i64";
      case Type::f32:
        return os << "f32";
      case Type::f64:
        return os << "f64";
      case Type::v128:
        return os << "v128";
    }
  }

#if TRACE_CANONICALIZATION
  os << "(;" << ((type.getID() >> 4) % 1000) << ";) ";
#endif
  if (type.isTuple()) {
    print(type.getTuple());
  } else if (type.isRef()) {
    auto heapType = type.getHeapType();
    if (type.isNullable() && heapType.isBasic() && !heapType.isShared()) {
      if (type.isExact()) {
        os << "(exact ";
      }
      // Print shorthands for certain basic heap types.
      switch (heapType.getBasic(Unshared)) {
        case HeapType::ext:
          os << "externref";
          break;
        case HeapType::func:
          os << "funcref";
          break;
        case HeapType::cont:
          os << "contref";
          break;
        case HeapType::any:
          os << "anyref";
          break;
        case HeapType::eq:
          os << "eqref";
          break;
        case HeapType::i31:
          os << "i31ref";
          break;
        case HeapType::struct_:
          os << "structref";
          break;
        case HeapType::array:
          os << "arrayref";
          break;
        case HeapType::exn:
          os << "exnref";
          break;
        case HeapType::string:
          os << "stringref";
          break;
        case HeapType::none:
          os << "nullref";
          break;
        case HeapType::noext:
          os << "nullexternref";
          break;
        case HeapType::nofunc:
          os << "nullfuncref";
          break;
        case HeapType::nocont:
          os << "nullcontref";
          break;
        case HeapType::noexn:
          os << "nullexnref";
          break;
      }
      if (type.isExact()) {
        os << ')';
      }
      return os;
    }
    os << "(ref ";
    if (type.isNullable()) {
      os << "null ";
    }
    if (type.isExact()) {
      os << "(exact ";
    }
    printHeapTypeName(heapType);
    if (type.isExact()) {
      os << ')';
    }
    os << ')';
  } else {
    WASM_UNREACHABLE("unexpected type");
  }
  return os;
}